

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

qsizetype stringWidth(QStringView text)

{
  long lVar1;
  long in_FS_OFFSET;
  undefined8 local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (text.m_size < 1) {
    local_18 = 0;
  }
  else {
    stringWidth();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_18;
  }
  __stack_chk_fail();
}

Assistant:

static qsizetype stringWidth(QStringView text)
{
    QStringIterator counter(text);
    qsizetype count = 0;
    while (counter.hasNext()) {
        ++count;
        [[maybe_unused]] auto ch = counter.next();
    }
    return count;
}